

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

App * __thiscall CLI::App::get_subcommand(App *this,string *subcom)

{
  pointer puVar1;
  App *this_00;
  bool bVar2;
  OptionNotFound *this_01;
  pointer puVar3;
  string local_70;
  string local_50;
  
  puVar3 = (this->subcommands_).
           super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->subcommands_).
           super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar3 == puVar1) {
      this_01 = (OptionNotFound *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string((string *)&local_70,(string *)subcom);
      OptionNotFound::OptionNotFound(this_01,&local_70);
      __cxa_throw(this_01,&OptionNotFound::typeinfo,Error::~Error);
    }
    this_00 = (puVar3->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
              super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
              super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
    ::std::__cxx11::string::string((string *)&local_50,(string *)subcom);
    bVar2 = check_name(this_00,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    if (bVar2) break;
    puVar3 = puVar3 + 1;
  }
  return (puVar3->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
         super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
         super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
}

Assistant:

App *get_subcommand(std::string subcom) const {
        for(const App_p &subcomptr : subcommands_)
            if(subcomptr->check_name(subcom))
                return subcomptr.get();
        throw OptionNotFound(subcom);
    }